

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O0

void mock(StatsdServer *server,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *messages)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  long lVar4;
  byte local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  size_type local_48;
  size_type end;
  size_type start;
  string recvd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages_local;
  StatsdServer *server_local;
  
  do {
    Statsd::StatsdServer::receive_abi_cxx11_((StatsdServer *)&start);
    end = 0xffffffffffffffff;
    do {
      end = end + 1;
      local_48 = std::__cxx11::string::find((char)&start,10);
      std::__cxx11::string::substr((ulong)local_68,(ulong)&start);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)messages,
                 local_68);
      std::__cxx11::string::~string((string *)local_68);
      end = local_48;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(messages);
      lVar4 = std::__cxx11::string::find((char *)pvVar3,0x111050);
      if (lVar4 != -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(messages);
        bVar1 = true;
        goto LAB_00103808;
      }
    } while (end != 0xffffffffffffffff);
    bVar1 = false;
LAB_00103808:
    std::__cxx11::string::~string((string *)&start);
    if (bVar1) {
      return;
    }
    Statsd::StatsdServer::errorMessage_abi_cxx11_(server);
    uVar2 = std::__cxx11::string::empty();
    local_89 = 0;
    if ((uVar2 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(messages);
      local_89 = std::__cxx11::string::empty();
      local_89 = local_89 ^ 0xff;
    }
    if ((local_89 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void mock(StatsdServer& server, std::vector<std::string>& messages) {
    do {
        // Grab the messages that are waiting
        auto recvd = server.receive();

        // Split the messages on '\n'
        auto start = std::string::npos;
        do {
            // Keep this message
            auto end = recvd.find('\n', ++start);
            messages.emplace_back(recvd.substr(start, end));
            start = end;

            // Bail if we found the special quit message
            if (messages.back().find("DONE") != std::string::npos) {
                messages.pop_back();
                return;
            }
        } while (start != std::string::npos);
    } while (server.errorMessage().empty() && !messages.back().empty());
}